

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multistream.h
# Opt level: O3

int __thiscall ipx::Multistream::multibuffer::overflow(multibuffer *this,int c)

{
  pointer ppbVar1;
  basic_streambuf<char,_std::char_traits<char>_> *pbVar2;
  pointer ppbVar3;
  
  ppbVar3 = (this->buffers).
            super__Vector_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_streambuf<char,_std::char_traits<char>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppbVar1 = (this->buffers).
            super__Vector_base<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_streambuf<char,_std::char_traits<char>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppbVar3 != ppbVar1) {
    do {
      pbVar2 = *ppbVar3;
      if (*(undefined1 **)(pbVar2 + 0x28) < *(undefined1 **)(pbVar2 + 0x30)) {
        **(undefined1 **)(pbVar2 + 0x28) = (char)c;
        *(long *)(pbVar2 + 0x28) = *(long *)(pbVar2 + 0x28) + 1;
      }
      else {
        (**(code **)(*(long *)pbVar2 + 0x68))(pbVar2,c & 0xff);
      }
      ppbVar3 = ppbVar3 + 1;
    } while (ppbVar3 != ppbVar1);
  }
  return c;
}

Assistant:

int overflow(int c) override {
            for (std::streambuf* b : buffers)
                b->sputc(static_cast<char>(c));
            return c;
        }